

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators.h
# Opt level: O2

void __thiscall spdlog::populators::level_populator::~level_populator(level_populator *this)

{
  pattern_populator::~pattern_populator(&this->super_pattern_populator);
  operator_delete(this);
  return;
}

Assistant:

class SPDLOG_API level_populator : public pattern_populator
{
public:
    level_populator();
}